

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O2

AddressType __thiscall
cfd::core::DescriptorScriptReference::GetAddressType(DescriptorScriptReference *this)

{
  bool bVar1;
  CfdException *pCVar2;
  Script *pSVar3;
  allocator local_39;
  undefined1 local_38 [32];
  
  if (this->script_type_ == kDescriptorScriptAddr) {
    return (this->address_script_).addr_type_;
  }
  if (this->script_type_ == kDescriptorScriptRaw) {
    pSVar3 = &this->locking_script_;
    bVar1 = Script::IsP2wpkhScript(pSVar3);
    if (bVar1) {
      return kP2wpkhAddress;
    }
    bVar1 = Script::IsP2wshScript(pSVar3);
    if (bVar1) {
      return kP2wshAddress;
    }
    bVar1 = Script::IsTaprootScript(pSVar3);
    if (bVar1) {
      return kTaprootAddress;
    }
    bVar1 = Script::IsP2shScript(pSVar3);
    if (bVar1) {
      return kP2shAddress;
    }
    bVar1 = Script::IsP2pkhScript(pSVar3);
    if (!bVar1) {
      local_38._0_8_ = "cfdcore_descriptor.cpp";
      local_38._8_4_ = 699;
      local_38._16_8_ = "GetAddressType";
      logger::warn<>((CfdSourceLocation *)local_38,
                     "Failed to GenerateAddress. raw type descriptor is not support.");
      pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)local_38,"raw type descriptor is not support.",&local_39);
      CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_38);
      __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  else {
    pSVar3 = &this->locking_script_;
    bVar1 = Script::IsP2shScript(pSVar3);
    if (bVar1) {
      bVar1 = Script::IsP2wpkhScript(&this->redeem_script_);
      if (!bVar1) {
        bVar1 = Script::IsP2wshScript(&this->redeem_script_);
        return (uint)bVar1 * 4 + kP2shAddress;
      }
      return kP2shP2wpkhAddress;
    }
    bVar1 = Script::IsP2wpkhScript(pSVar3);
    if (bVar1) {
      return kP2wpkhAddress;
    }
    bVar1 = Script::IsP2wshScript(pSVar3);
    if (bVar1) {
      return kP2wshAddress;
    }
    bVar1 = Script::IsTaprootScript(pSVar3);
    if (bVar1) {
      return kTaprootAddress;
    }
    bVar1 = Script::IsP2pkhScript(pSVar3);
    if (!bVar1) {
      bVar1 = Script::IsP2pkScript(pSVar3);
      if (bVar1) {
        return kP2shAddress;
      }
      bVar1 = Script::IsMultisigScript(pSVar3);
      if (!bVar1) {
        local_38._0_8_ = "cfdcore_descriptor.cpp";
        local_38._8_4_ = 0x2dc;
        local_38._16_8_ = "GetAddressType";
        logger::warn<>((CfdSourceLocation *)local_38,
                       "Failed to GetAddressType. unknown address type.");
        pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string((string *)local_38,"unknown address type.",&local_39);
        CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_38);
        __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
      }
      return kP2shAddress;
    }
  }
  return kP2pkhAddress;
}

Assistant:

AddressType DescriptorScriptReference::GetAddressType() const {
  switch (script_type_) {
    case DescriptorScriptType::kDescriptorScriptRaw:
      if (locking_script_.IsP2wpkhScript()) {
        return AddressType::kP2wpkhAddress;
      } else if (locking_script_.IsP2wshScript()) {
        return AddressType::kP2wshAddress;
      } else if (locking_script_.IsTaprootScript()) {
        return AddressType::kTaprootAddress;
      } else if (locking_script_.IsP2shScript()) {
        return AddressType::kP2shAddress;
      } else if (locking_script_.IsP2pkhScript()) {
        return AddressType::kP2pkhAddress;
      }
      warn(
          CFD_LOG_SOURCE,
          "Failed to GenerateAddress. raw type descriptor is not support.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "raw type descriptor is not support.");
    case DescriptorScriptType::kDescriptorScriptAddr:
      return address_script_.GetAddressType();
    default:
      break;
  }
  if (locking_script_.IsP2shScript()) {
    if (redeem_script_.IsP2wpkhScript()) {
      return AddressType::kP2shP2wpkhAddress;
    } else if (redeem_script_.IsP2wshScript()) {
      return AddressType::kP2shP2wshAddress;
    }
    return AddressType::kP2shAddress;
  }
  if (locking_script_.IsP2wpkhScript()) {
    return AddressType::kP2wpkhAddress;
  }
  if (locking_script_.IsP2wshScript()) {
    return AddressType::kP2wshAddress;
  }
  if (locking_script_.IsTaprootScript()) {
    return AddressType::kTaprootAddress;
  }
  if (locking_script_.IsP2pkhScript()) {
    return AddressType::kP2pkhAddress;
  }
  if (locking_script_.IsP2pkScript() || locking_script_.IsMultisigScript()) {
    return AddressType::kP2shAddress;  // unsupported script
  }
  warn(CFD_LOG_SOURCE, "Failed to GetAddressType. unknown address type.");
  throw CfdException(
      CfdError::kCfdIllegalArgumentError, "unknown address type.");
}